

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcColumnType::IfcColumnType(IfcColumnType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcColumnType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00857a08);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8578d8;
  *(undefined8 *)&this->field_0x1c0 = 0x8579f0;
  *(undefined8 *)&this->field_0x88 = 0x857900;
  *(undefined8 *)&this->field_0x98 = 0x857928;
  *(undefined8 *)&this->field_0xf0 = 0x857950;
  *(undefined8 *)&this->field_0x148 = 0x857978;
  *(undefined8 *)&this->field_0x180 = 0x8579a0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8579c8;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>).field_0x18
       = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcColumnType() : Object("IfcColumnType") {}